

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::render
          (FlushFinishCase *this,int numDrawCalls)

{
  int iVar1;
  undefined4 extraout_var;
  deUint8 indices [6];
  undefined4 local_20;
  undefined2 local_1c;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c = 0x301;
  local_20 = 0x2020100;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x188))(0x4500);
  if (0 < numDrawCalls) {
    do {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x568))(4,6,0x1401,&local_20);
      numDrawCalls = numDrawCalls + -1;
    } while (numDrawCalls != 0);
  }
  return;
}

Assistant:

void FlushFinishCase::render (int numDrawCalls)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	for (int ndx = 0; ndx < numDrawCalls; ndx++)
		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_BYTE, &indices[0]);
}